

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

exception * __thiscall nlohmann::detail::exception::name(exception *this,string *ename,int id_)

{
  __cxx11 local_b0 [48];
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [36];
  int local_1c;
  string *psStack_18;
  int id__local;
  string *ename_local;
  
  local_1c = id_;
  psStack_18 = ename;
  ename_local = (string *)this;
  std::operator+((char *)local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "[json.exception.");
  std::operator+(local_60,(char *)local_80);
  std::__cxx11::to_string(local_b0,local_1c);
  std::operator+(local_40,local_60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_80);
  return this;
}

Assistant:

static std::string name(const std::string& ename, int id_)
    {
        return "[json.exception." + ename + "." + std::to_string(id_) + "] ";
    }